

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voc.c
# Opt level: O0

void vocset(voccxdef *ctx,vocdef *v,prpnum p,objnum objn,int classflg,uchar *wrdtxt,int len,
           uchar *wrd2,int len2)

{
  uint uVar1;
  undefined8 *in_RSI;
  long in_RDI;
  uchar *in_R9;
  uint hshval;
  int in_stack_000000b0;
  objnum in_stack_000000b4;
  prpnum in_stack_000000b6;
  vocdef *in_stack_000000b8;
  voccxdef *in_stack_000000c0;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  uVar1 = vochsh(in_R9,in_stack_ffffffffffffffdc);
  *in_RSI = *(undefined8 *)(in_RDI + 0x670 + (ulong)uVar1 * 8);
  *(undefined8 **)(in_RDI + 0x670 + (ulong)uVar1 * 8) = in_RSI;
  *(char *)(in_RSI + 1) = (char)wrdtxt;
  *(char *)((long)in_RSI + 9) = (char)v;
  voccpy(in_R9,(uchar *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),0);
  if (CONCAT26(p,CONCAT24(objn,classflg)) != 0) {
    voccpy(in_R9,(uchar *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),0);
  }
  vocwset(in_stack_000000c0,in_stack_000000b8,in_stack_000000b6,in_stack_000000b4,in_stack_000000b0)
  ;
  return;
}

Assistant:

static void vocset(voccxdef *ctx, vocdef *v, prpnum p, objnum objn,
                   int classflg, uchar *wrdtxt, int len,
                   uchar *wrd2, int len2)
{
    uint hshval = vochsh(wrdtxt, len);
    
    v->vocnxt = ctx->voccxhsh[hshval];
    ctx->voccxhsh[hshval] = v;
    
    v->voclen = len;
    v->vocln2 = len2;
    voccpy(v->voctxt, wrdtxt, len);
    if (wrd2) voccpy(v->voctxt + len, wrd2, len2);

    /* allocate and initialize a vocwdef for the object */
    vocwset(ctx, v, p, objn, classflg);
}